

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asyn-thread.c
# Opt level: O3

CURLcode Curl_resolver_wait_resolv(connectdata *conn,Curl_dns_entry **entry)

{
  _Bool _Var1;
  void *pvVar2;
  Curl_dns_entry *pCVar3;
  int iVar4;
  CURLcode CVar5;
  char *pcVar6;
  
  iVar4 = Curl_thread_join((pthread_t **)(conn->async).os_specific);
  if (iVar4 == 0) {
    CVar5 = CURLE_OK;
  }
  else {
    pvVar2 = (conn->async).os_specific;
    CVar5 = Curl_addrinfo_callback
                      (conn,*(int *)((long)pvVar2 + 0x34),*(Curl_addrinfo **)((long)pvVar2 + 0x38));
    *(undefined8 *)((long)pvVar2 + 0x38) = 0;
  }
  (conn->async).done = true;
  pCVar3 = (conn->async).dns;
  if (entry != (Curl_dns_entry **)0x0) {
    *entry = pCVar3;
  }
  if (pCVar3 == (Curl_dns_entry *)0x0) {
    _Var1 = (conn->bits).httpproxy;
    pcVar6 = "host";
    if (_Var1 != false) {
      pcVar6 = "proxy";
    }
    CVar5 = CURLE_COULDNT_RESOLVE_HOST - _Var1;
    Curl_failf(conn->data,"Could not resolve %s: %s",pcVar6,(conn->async).hostname);
  }
  destroy_async_data(&conn->async);
  if ((conn->async).dns == (Curl_dns_entry *)0x0) {
    Curl_conncontrol(conn,1);
  }
  return CVar5;
}

Assistant:

CURLcode Curl_resolver_wait_resolv(struct connectdata *conn,
                                   struct Curl_dns_entry **entry)
{
  struct thread_data   *td = (struct thread_data*) conn->async.os_specific;
  CURLcode result = CURLE_OK;

  DEBUGASSERT(conn && td);

  /* wait for the thread to resolve the name */
  if(Curl_thread_join(&td->thread_hnd))
    result = getaddrinfo_complete(conn);
  else
    DEBUGASSERT(0);

  conn->async.done = TRUE;

  if(entry)
    *entry = conn->async.dns;

  if(!conn->async.dns)
    /* a name was not resolved, report error */
    result = resolver_error(conn);

  destroy_async_data(&conn->async);

  if(!conn->async.dns)
    connclose(conn, "asynch resolve failed");

  return result;
}